

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_proxy_delete_property(JSContext *ctx,JSValue obj,JSAtom atom)

{
  int iVar1;
  int iVar2;
  JSProxyData *pJVar3;
  JSValue JVar4;
  JSValue JVar5;
  JSValue method;
  JSPropertyDescriptor desc;
  JSValueUnion local_58;
  int64_t iStack_50;
  JSValue local_48;
  
  pJVar3 = get_proxy_method(ctx,&method,obj,100);
  if (pJVar3 == (JSProxyData *)0x0) {
    return -1;
  }
  if ((int)method.tag == 3) {
    iVar1 = JS_DeleteProperty(ctx,pJVar3->target,atom,0);
    return iVar1;
  }
  JVar4 = JS_AtomToValue(ctx,atom);
  if ((int)JVar4.tag == 6) {
    JVar4.tag = method.tag;
    JVar4.u.float64 = method.u.float64;
    JS_FreeValue(ctx,JVar4);
    return -1;
  }
  local_58.ptr = *(void **)&(pJVar3->target).u;
  iStack_50 = (pJVar3->target).tag;
  JVar5.tag = method.tag;
  JVar5.u.float64 = method.u.float64;
  local_48 = JVar4;
  JVar5 = JS_CallFree(ctx,JVar5,pJVar3->handler,2,(JSValue *)&local_58);
  JS_FreeValue(ctx,JVar4);
  if ((int)JVar5.tag == 6) {
    return -1;
  }
  iVar1 = JS_ToBoolFree(ctx,JVar5);
  if (iVar1 == 0) {
    return 0;
  }
  iVar2 = JS_GetOwnPropertyInternal(ctx,&desc,(JSObject *)(pJVar3->target).u.ptr,atom);
  if (iVar2 < 0) {
    return -1;
  }
  if (iVar2 == 0) {
    return iVar1;
  }
  if (((byte)desc.flags & 1) != 0) {
    iVar2 = JS_IsExtensible(ctx,pJVar3->target);
    if (iVar2 < 0) goto LAB_0013a45b;
    if (iVar2 != 0) {
      js_free_desc(ctx,&desc);
      return iVar1;
    }
  }
  JS_ThrowTypeError(ctx,"proxy: inconsistent deleteProperty");
LAB_0013a45b:
  js_free_desc(ctx,&desc);
  return -1;
}

Assistant:

static int js_proxy_delete_property(JSContext *ctx, JSValueConst obj,
                                    JSAtom atom)
{
    JSProxyData *s;
    JSValue method, ret, atom_val;
    int res, res2, is_extensible;
    JSValueConst args[2];

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_deleteProperty);
    if (!s)
        return -1;
    if (JS_IsUndefined(method)) {
        return JS_DeleteProperty(ctx, s->target, atom, 0);
    }
    atom_val = JS_AtomToValue(ctx, atom);;
    if (JS_IsException(atom_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = atom_val;
    ret = JS_CallFree(ctx, method, s->handler, 2, args);
    JS_FreeValue(ctx, atom_val);
    if (JS_IsException(ret))
        return -1;
    res = JS_ToBoolFree(ctx, ret);
    if (res) {
        JSPropertyDescriptor desc;
        res2 = JS_GetOwnPropertyInternal(ctx, &desc, JS_VALUE_GET_OBJ(s->target), atom);
        if (res2 < 0)
            return -1;
        if (res2) {
            if (!(desc.flags & JS_PROP_CONFIGURABLE))
                goto fail;
            is_extensible = JS_IsExtensible(ctx, s->target);
            if (is_extensible < 0)
                goto fail1;
            if (!is_extensible) {
                /* proxy-missing-checks */
            fail:
                JS_ThrowTypeError(ctx, "proxy: inconsistent deleteProperty");
            fail1:
                js_free_desc(ctx, &desc);
                return -1;
            }
            js_free_desc(ctx, &desc);
        }
    }
    return res;
}